

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_draw_vertex(void *dst,nk_convert_config *config,nk_vec2 pos,nk_vec2 uv,nk_colorf color)

{
  nk_draw_vertex_layout_attribute nVar1;
  nk_draw_vertex_layout_format value_count;
  uint uVar2;
  nk_size nVar3;
  nk_color nVar4;
  uint uVar5;
  ulong in_RCX;
  void *dst0;
  nk_vec2 *values;
  nk_colorf *src0;
  nk_draw_vertex_layout_element *pnVar6;
  float fVar7;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  nk_size nStack_80;
  nk_colorf color_local;
  nk_color bgra;
  undefined2 uStack_64;
  undefined4 uStack_60;
  unkbyte10 Stack_62;
  nk_vec2 uv_local;
  nk_vec2 pos_local;
  
  pnVar6 = config->vertex_layout;
  nVar3 = config->vertex_size;
  color_local = color;
  uv_local = uv;
  pos_local = pos;
  do {
    auVar11 = _bgra;
    nVar1 = pnVar6->attribute;
    if ((nVar1 == NK_VERTEX_ATTRIBUTE_COUNT) ||
       (value_count = pnVar6->format, value_count == NK_FORMAT_COUNT)) {
      return (void *)((long)dst + nVar3);
    }
    dst0 = (void *)(pnVar6->offset + (long)dst);
    values = &pos_local;
    if (nVar1 == NK_VERTEX_POSITION) {
LAB_0011fe4b:
      nk_draw_vertex_element(dst0,&values->x,value_count,(nk_draw_vertex_layout_format)in_RCX);
      goto LAB_00120127;
    }
    if (nVar1 != NK_VERTEX_COLOR) {
      values = &uv_local;
      if (nVar1 != NK_VERTEX_TEXCOORD) {
        __assert_fail("0 && \"wrong element attribute\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x1feb,
                      "void *nk_draw_vertex(void *, const struct nk_convert_config *, struct nk_vec2, struct nk_vec2, struct nk_colorf)"
                     );
      }
      goto LAB_0011fe4b;
    }
    if (value_count < NK_FORMAT_COLOR_BEGIN) {
      __assert_fail("format >= NK_FORMAT_COLOR_BEGIN",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x1f68,
                    "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                   );
    }
    switch(value_count) {
    case NK_FORMAT_COLOR_BEGIN:
    case NK_FORMAT_R8G8B8A8:
    case NK_FORMAT_RGB32:
    case NK_FORMAT_COLOR_END:
      nVar4 = nk_rgba_fv(&color_local.r);
      goto LAB_0011fe32;
    case NK_FORMAT_R16G15B16:
      fVar7 = color_local.b * 65535.0;
      uVar5 = (fVar7 < 0.0 && fVar7 < 65535.0) - 1;
      uVar21 = (int)fVar7;
      if (65535.0 <= fVar7) {
        uVar21 = uVar5;
      }
      fVar15 = color_local.r * 65535.0;
      fVar16 = color_local.g * 65535.0;
      auVar20._4_4_ = -(uint)(65535.0 <= fVar16);
      auVar20._0_4_ = -(uint)(65535.0 <= fVar15);
      auVar20._8_4_ = 0xffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar28._0_4_ = (int)fVar15;
      auVar28._4_4_ = (int)fVar16;
      auVar28._8_8_ = 0;
      auVar12._4_4_ = -(uint)(fVar16 < 0.0);
      auVar12._0_4_ = -(uint)(fVar15 < 0.0);
      auVar12._8_8_ = 0;
      auVar24._0_4_ = -(uint)(fVar15 < 65535.0 && fVar15 < 0.0);
      auVar24._4_4_ = -(uint)(fVar16 < 65535.0 && fVar16 < 0.0);
      auVar24._8_4_ = auVar24._4_4_;
      auVar24._12_4_ = 0;
      auVar11 = packssdw(auVar12 | auVar20,auVar12 | auVar20);
      auVar19 = pshuflw(auVar20,auVar24 ^ _DAT_001541c0,0xe8);
      auVar23 = pshuflw(auVar24 ^ _DAT_001541c0,auVar28,0xe8);
      uVar2 = ~auVar11._0_4_ & auVar23._0_4_ | auVar19._0_4_ & auVar11._0_4_;
      if (fVar7 < 0.0) {
        uVar21 = uVar5;
      }
      in_RCX = (ulong)uVar21;
      uStack_64 = (short)uVar21;
      bgra.r = (char)uVar2;
      bgra.g = (char)(uVar2 >> 8);
      bgra.b = (char)(uVar2 >> 0x10);
      bgra.a = (char)(uVar2 >> 0x18);
      src0 = (nk_colorf *)&bgra;
      nStack_80 = 6;
      break;
    case NK_FORMAT_R32G32B32:
      fVar7 = color_local.r * 4.2949673e+09;
      fVar15 = color_local.g * 4.2949673e+09;
      auVar14._0_4_ = (int)fVar7;
      auVar14._4_4_ = (int)fVar15;
      auVar14._8_8_ = 0;
      auVar29._0_4_ = auVar14._0_4_ >> 0x1f;
      auVar29._4_4_ = auVar14._4_4_ >> 0x1f;
      auVar29._8_8_ = 0;
      auVar13._0_4_ = (int)(fVar7 - 2.1474836e+09);
      auVar13._4_4_ = (int)(fVar15 - 2.1474836e+09);
      auVar13._8_4_ = 0x80000000;
      auVar13._12_4_ = 0x80000000;
      fVar16 = color_local.b * 4.2949673e+09;
      auVar14 = auVar13 & auVar29 | auVar14;
      in_RCX = 0;
      uStack_60 = (uint)(long)fVar16;
      if (4.2949673e+09 <= fVar16) {
        uStack_60 = 0;
      }
      uVar21 = ~-(uint)(fVar7 < 0.0 || 4.2949673e+09 <= fVar7) & auVar14._0_4_;
      _uStack_64 = ~-(uint)(fVar15 < 0.0 || 4.2949673e+09 <= fVar15) & auVar14._4_4_;
      bgra.r = (char)uVar21;
      bgra.g = (char)(uVar21 >> 8);
      bgra.b = (char)(uVar21 >> 0x10);
      bgra.a = (char)(uVar21 >> 0x18);
      if (fVar16 < 0.0) {
        uStack_60 = 0;
      }
      Stack_62._6_4_ = auVar11._12_4_;
      src0 = (nk_colorf *)&bgra;
      nStack_80 = 0xc;
      break;
    case NK_FORMAT_B8G8R8A8:
      nVar4 = nk_rgba_fv(&color_local.r);
      in_RCX = (ulong)((uint)nVar4 >> 0x18);
      nVar4 = nk_rgba((uint)nVar4 >> 0x10 & 0xff,(uint)nVar4 >> 8 & 0xff,(uint)nVar4 & 0xff,
                      (uint)nVar4 >> 0x18);
LAB_0011fe32:
      bgra = nVar4;
      src0 = (nk_colorf *)&bgra;
      nStack_80 = 4;
      break;
    case NK_FORMAT_R16G15B16A16:
      fVar7 = color_local.r * 65535.0;
      fVar15 = color_local.g * 65535.0;
      fVar16 = color_local.b * 65535.0;
      fVar17 = color_local.a * 65535.0;
      auVar18._4_4_ = -(uint)(65535.0 <= fVar15);
      auVar18._0_4_ = -(uint)(65535.0 <= fVar7);
      auVar18._8_4_ = -(uint)(65535.0 <= fVar16);
      auVar18._12_4_ = -(uint)(65535.0 <= fVar17);
      auVar27._0_4_ = (int)fVar7;
      auVar27._4_4_ = (int)fVar15;
      auVar27._8_4_ = (int)fVar16;
      auVar27._12_4_ = (int)fVar17;
      auVar10._4_4_ = -(uint)(fVar15 < 0.0);
      auVar10._0_4_ = -(uint)(fVar7 < 0.0);
      auVar10._8_4_ = -(uint)(fVar16 < 0.0);
      auVar10._12_4_ = -(uint)(fVar17 < 0.0);
      auVar22._0_4_ = -(uint)(fVar7 < 65535.0 && fVar7 < 0.0);
      auVar22._4_4_ = -(uint)(fVar15 < 65535.0 && fVar15 < 0.0);
      auVar22._8_4_ = -(uint)(fVar16 < 65535.0 && fVar16 < 0.0);
      auVar22._12_4_ = -(uint)(fVar17 < 65535.0 && fVar17 < 0.0);
      auVar23 = packssdw(auVar22,auVar22);
      auVar11 = packssdw(auVar10 | auVar18,auVar10 | auVar18);
      auVar19 = pshuflw(auVar18,auVar27,0xe8);
      auVar19 = pshufhw(auVar19,auVar19,0xe8);
      _bgra = ~auVar11._0_8_ & CONCAT44(auVar19._8_4_,auVar19._0_4_) |
              ~auVar23._0_8_ & auVar11._0_8_;
      src0 = (nk_colorf *)&bgra;
      nStack_80 = 8;
      break;
    case NK_FORMAT_R32G32B32A32:
      fVar7 = color_local.r * 4.2949673e+09;
      fVar15 = color_local.g * 4.2949673e+09;
      fVar16 = color_local.b * 4.2949673e+09;
      fVar17 = color_local.a * 4.2949673e+09;
      auVar9._0_4_ = (int)fVar7;
      auVar9._4_4_ = (int)fVar15;
      auVar9._8_4_ = (int)fVar16;
      auVar9._12_4_ = (int)fVar17;
      auVar26._0_4_ = auVar9._0_4_ >> 0x1f;
      auVar26._4_4_ = auVar9._4_4_ >> 0x1f;
      auVar26._8_4_ = auVar9._8_4_ >> 0x1f;
      auVar26._12_4_ = auVar9._12_4_ >> 0x1f;
      auVar8._0_4_ = (int)(fVar7 - 2.1474836e+09);
      auVar8._4_4_ = (int)(fVar15 - 2.1474836e+09);
      auVar8._8_4_ = (int)(fVar16 - 2.1474836e+09);
      auVar8._12_4_ = (int)(fVar17 - 2.1474836e+09);
      auVar9 = auVar8 & auVar26 | auVar9;
      bgra = (nk_color)(~-(uint)(fVar7 < 0.0 || 4.2949673e+09 <= fVar7) & auVar9._0_4_);
      _uStack_64 = ~-(uint)(fVar15 < 0.0 || 4.2949673e+09 <= fVar15) & auVar9._4_4_;
      uStack_60 = ~-(uint)(fVar16 < 0.0 || 4.2949673e+09 <= fVar16) & auVar9._8_4_;
      Stack_62._6_4_ = ~-(uint)(fVar17 < 0.0 || 4.2949673e+09 <= fVar17) & auVar9._12_4_;
      src0 = (nk_colorf *)&bgra;
      goto LAB_00120079;
    case NK_FORMAT_R32G32B32A32_FLOAT:
      src0 = &color_local;
LAB_00120079:
      nStack_80 = 0x10;
      break;
    case NK_FORMAT_R32G32B32A32_DOUBLE:
      auVar23._0_4_ = -(uint)(0.0 < color_local.r || 1.0 < color_local.r);
      iVar25 = -(uint)(0.0 < color_local.g || 1.0 < color_local.g);
      auVar23._4_4_ = auVar23._0_4_;
      auVar23._8_4_ = iVar25;
      auVar23._12_4_ = iVar25;
      iVar25 = -(uint)(color_local.r <= 0.0 || 1.0 < color_local.r);
      iVar30 = -(uint)(color_local.g <= 0.0 || 1.0 < color_local.g);
      auVar19._4_4_ = iVar25;
      auVar19._0_4_ = iVar25;
      auVar19._8_4_ = iVar30;
      auVar19._12_4_ = iVar30;
      auVar11._0_8_ = (double)color_local.r;
      auVar11._8_8_ = (double)color_local.g;
      _bgra = ~auVar19 & auVar11 | auVar23 & _DAT_00154150 & auVar19;
      src0 = (nk_colorf *)&bgra;
      nStack_80 = 0x20;
      break;
    default:
      __assert_fail("format <= NK_FORMAT_COLOR_END",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x1f69,
                    "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                   );
    }
    nk_memcopy(dst0,src0,nStack_80);
LAB_00120127:
    pnVar6 = pnVar6 + 1;
  } while( true );
}

Assistant:

NK_INTERN void*
nk_draw_vertex(void *dst, const struct nk_convert_config *config,
    struct nk_vec2 pos, struct nk_vec2 uv, struct nk_colorf color)
{
    void *result = (void*)((char*)dst + config->vertex_size);
    const struct nk_draw_vertex_layout_element *elem_iter = config->vertex_layout;
    while (!nk_draw_vertex_layout_element_is_end_of_layout(elem_iter)) {
        void *address = (void*)((char*)dst + elem_iter->offset);
        switch (elem_iter->attribute) {
        case NK_VERTEX_ATTRIBUTE_COUNT:
        default: NK_ASSERT(0 && "wrong element attribute");
        case NK_VERTEX_POSITION: nk_draw_vertex_element(address, &pos.x, 2, elem_iter->format); break;
        case NK_VERTEX_TEXCOORD: nk_draw_vertex_element(address, &uv.x, 2, elem_iter->format); break;
        case NK_VERTEX_COLOR: nk_draw_vertex_color(address, &color.r, elem_iter->format); break;
        }
        elem_iter++;
    }
    return result;
}